

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.hpp
# Opt level: O0

void __thiscall ot::commissioner::CommissionerApp::~CommissionerApp(CommissionerApp *this)

{
  CommissionerApp *this_local;
  
  (this->super_CommissionerHandler)._vptr_CommissionerHandler =
       (_func_int **)&PTR_OnJoinerRequest_abi_cxx11__00481440;
  std::
  map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
  ::~map(&this->mDiagAnsDataMap);
  BbrDataset::~BbrDataset(&this->mBbrDataset);
  CommissionerDataset::~CommissionerDataset(&this->mCommDataset);
  PendingOperationalDataset::~PendingOperationalDataset(&this->mPendingDataset);
  ActiveOperationalDataset::~ActiveOperationalDataset(&this->mActiveDataset);
  std::
  map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
  ::~map(&this->mEnergyReports);
  std::
  map<unsigned_short,_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_>_>_>
  ::~map(&this->mPanIdConflicts);
  std::
  map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
  ::~map(&this->mJoiners);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->mSignedToken);
  std::shared_ptr<ot::commissioner::Commissioner>::~shared_ptr(&this->mCommissioner);
  CommissionerHandler::~CommissionerHandler(&this->super_CommissionerHandler);
  return;
}

Assistant:

MOCKABLE ~CommissionerApp() = default;